

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_ADXR_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 in_RDI;
  double *unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  int *in_stack_00000038;
  double *in_stack_00000040;
  
  TVar1 = TA_ADXR((int)outBegIdx,outNBElement._4_4_,in_stack_00000010,in_stack_00000008,
                  unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int *)params,in_stack_00000038,
                  in_stack_00000040);
  return TVar1;
}

Assistant:

TA_RetCode TA_ADXR_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_ADXR(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inPrice.high, /* inHigh */
/* Generated */              params->in[0].data.inPrice.low, /* inLow */
/* Generated */              params->in[0].data.inPrice.close, /* inClose */
/* Generated */              params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal /*  outReal */ );
/* Generated */ }